

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetLinkLibrariesCommand.cxx
# Opt level: O0

bool __thiscall
cmTargetLinkLibrariesCommand::HandleLibrary
          (cmTargetLinkLibrariesCommand *this,string *lib,cmTargetLinkLibraryType llt)

{
  cmMakefile *pcVar1;
  cmTarget *pcVar2;
  MessageType t;
  bool bVar3;
  TargetType TVar4;
  PolicyStatus PVar5;
  ostream *poVar6;
  string *psVar7;
  char *pcVar8;
  size_type sVar9;
  cmake *this_00;
  reference pbVar10;
  PolicyID id;
  bool local_449;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_430;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_428;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_420;
  const_iterator i_1;
  string local_410;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3f0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3e8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3e0;
  const_iterator i;
  string prop;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  debugConfigs;
  undefined1 local_398 [4];
  PolicyStatus policy22Status;
  allocator local_371;
  string local_370;
  allocator local_349;
  string local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  undefined1 local_2e8 [8];
  string configLib;
  allocator local_2a1;
  string local_2a0;
  int local_27c;
  string local_278;
  char *local_258;
  char *existingSig;
  MessageType local_22c;
  char *pcStack_228;
  MessageType messageType;
  char *modal;
  ostringstream e;
  cmListFileContext local_a8;
  TLLSignature local_60;
  TLLSignature sig;
  allocator local_49;
  string local_48;
  cmTargetLinkLibraryType local_24;
  string *psStack_20;
  cmTargetLinkLibraryType llt_local;
  string *lib_local;
  cmTargetLinkLibrariesCommand *this_local;
  
  local_24 = llt;
  psStack_20 = lib;
  lib_local = (string *)this;
  TVar4 = cmTarget::GetType(this->Target);
  if ((TVar4 == INTERFACE_LIBRARY) &&
     (this->CurrentProcessingState != ProcessingKeywordLinkInterface)) {
    pcVar1 = (this->super_cmCommand).Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_48,
               "INTERFACE library can only be used with the INTERFACE keyword of target_link_libraries"
               ,&local_49);
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_48,false);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    this_local._7_1_ = 0;
    goto LAB_0055ae16;
  }
  local_449 = true;
  if ((((this->CurrentProcessingState != ProcessingPlainPrivateInterface) &&
       (local_449 = true, this->CurrentProcessingState != ProcessingPlainPublicInterface)) &&
      (local_449 = true, this->CurrentProcessingState != ProcessingKeywordPrivateInterface)) &&
     (local_449 = true, this->CurrentProcessingState != ProcessingKeywordPublicInterface)) {
    local_449 = this->CurrentProcessingState == ProcessingKeywordLinkInterface;
  }
  pcVar2 = this->Target;
  local_60 = (byte)~local_449 & PlainTLLSignature;
  cmMakefile::GetExecutionContext(&local_a8,(this->super_cmCommand).Makefile);
  bVar3 = cmTarget::PushTLLCommandTrace(pcVar2,(byte)~local_449 & PlainTLLSignature,&local_a8);
  cmListFileContext::~cmListFileContext(&local_a8);
  if (((bVar3 ^ 0xffU) & 1) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&modal);
    pcStack_228 = (char *)0x0;
    local_22c = AUTHOR_WARNING;
    PVar5 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0023);
    if (PVar5 != OLD) {
      if (PVar5 == WARN) {
        cmPolicies::GetPolicyWarning_abi_cxx11_((string *)&existingSig,(cmPolicies *)0x17,id);
        poVar6 = std::operator<<((ostream *)&modal,(string *)&existingSig);
        std::operator<<(poVar6,"\n");
        std::__cxx11::string::~string((string *)&existingSig);
        pcStack_228 = "should";
      }
      else if (PVar5 - NEW < 3) {
        pcStack_228 = "must";
        local_22c = FATAL_ERROR;
      }
    }
    if (pcStack_228 == (char *)0x0) {
LAB_0055a615:
      local_27c = 0;
    }
    else {
      local_258 = "keyword";
      if (local_60 == KeywordTLLSignature) {
        local_258 = "plain";
      }
      poVar6 = std::operator<<((ostream *)&modal,"The ");
      poVar6 = std::operator<<(poVar6,local_258);
      poVar6 = std::operator<<(poVar6,
                               " signature for target_link_libraries has already been used with the target \""
                              );
      psVar7 = cmTarget::GetName_abi_cxx11_(this->Target);
      poVar6 = std::operator<<(poVar6,(string *)psVar7);
      poVar6 = std::operator<<(poVar6,"\".  All uses of target_link_libraries with a target ");
      poVar6 = std::operator<<(poVar6,pcStack_228);
      std::operator<<(poVar6," be either all-keyword or all-plain.\n");
      cmTarget::GetTllSignatureTraces
                (this->Target,(ostringstream *)&modal,(uint)(local_60 == KeywordTLLSignature));
      t = local_22c;
      pcVar1 = (this->super_cmCommand).Makefile;
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage(pcVar1,t,&local_278,false);
      std::__cxx11::string::~string((string *)&local_278);
      if (local_22c != FATAL_ERROR) goto LAB_0055a615;
      this_local._7_1_ = 0;
      local_27c = 1;
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&modal);
    if (local_27c != 0) goto LAB_0055ae16;
  }
  if ((this->CurrentProcessingState != ProcessingKeywordLinkInterface) &&
     (this->CurrentProcessingState != ProcessingPlainLinkInterface)) {
    pcVar1 = (this->super_cmCommand).Makefile;
    psVar7 = cmTarget::GetName_abi_cxx11_(this->Target);
    cmMakefile::AddLinkLibraryForTarget(pcVar1,psVar7,psStack_20,local_24);
    if (this->CurrentProcessingState == ProcessingLinkLibraries) {
      pcVar2 = this->Target;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_2a0,"INTERFACE_LINK_LIBRARIES",&local_2a1);
      cmTarget::GetDebugGeneratorExpressions
                ((string *)((long)&configLib.field_2 + 8),this->Target,psStack_20,local_24);
      pcVar8 = (char *)std::__cxx11::string::c_str();
      cmTarget::AppendProperty(pcVar2,&local_2a0,pcVar8,false);
      std::__cxx11::string::~string((string *)(configLib.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)&local_2a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
      this_local._7_1_ = 1;
      goto LAB_0055ae16;
    }
    if ((this->CurrentProcessingState != ProcessingKeywordPublicInterface) &&
       (this->CurrentProcessingState != ProcessingPlainPublicInterface)) {
      TVar4 = cmTarget::GetType(this->Target);
      if (TVar4 == STATIC_LIBRARY) {
        cmTarget::GetDebugGeneratorExpressions((string *)local_2e8,this->Target,psStack_20,local_24)
        ;
        bVar3 = cmGeneratorExpression::IsValidTargetName(psStack_20);
        if ((bVar3) ||
           (sVar9 = cmGeneratorExpression::Find(psStack_20), sVar9 != 0xffffffffffffffff)) {
          std::operator+(&local_328,"$<LINK_ONLY:",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2e8);
          std::operator+(&local_308,&local_328,">");
          std::__cxx11::string::operator=((string *)local_2e8,(string *)&local_308);
          std::__cxx11::string::~string((string *)&local_308);
          std::__cxx11::string::~string((string *)&local_328);
        }
        pcVar2 = this->Target;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_348,"INTERFACE_LINK_LIBRARIES",&local_349);
        pcVar8 = (char *)std::__cxx11::string::c_str();
        cmTarget::AppendProperty(pcVar2,&local_348,pcVar8,false);
        std::__cxx11::string::~string((string *)&local_348);
        std::allocator<char>::~allocator((allocator<char> *)&local_349);
        std::__cxx11::string::~string((string *)local_2e8);
      }
      this_local._7_1_ = 1;
      goto LAB_0055ae16;
    }
  }
  pcVar2 = this->Target;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_370,"INTERFACE_LINK_LIBRARIES",&local_371);
  cmTarget::GetDebugGeneratorExpressions((string *)local_398,this->Target,psStack_20,local_24);
  pcVar8 = (char *)std::__cxx11::string::c_str();
  cmTarget::AppendProperty(pcVar2,&local_370,pcVar8,false);
  std::__cxx11::string::~string((string *)local_398);
  std::__cxx11::string::~string((string *)&local_370);
  std::allocator<char>::~allocator((allocator<char> *)&local_371);
  PVar5 = cmTarget::GetPolicyStatusCMP0022(this->Target);
  if ((PVar5 == OLD) || (PVar5 == WARN)) {
    TVar4 = cmTarget::GetType(this->Target);
    if (TVar4 == INTERFACE_LIBRARY) {
      this_local._7_1_ = 1;
    }
    else {
      this_00 = cmMakefile::GetCMakeInstance((this->super_cmCommand).Makefile);
      cmake::GetDebugConfigs_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&prop.field_2 + 8),this_00);
      std::__cxx11::string::string((string *)&i);
      if ((local_24 == DEBUG_LibraryType) || (local_24 == GENERAL_LibraryType)) {
        local_3e8._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&prop.field_2 + 8));
        __gnu_cxx::
        __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
        ::__normal_iterator<std::__cxx11::string*>
                  ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    *)&local_3e0,&local_3e8);
        while( true ) {
          local_3f0._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&prop.field_2 + 8));
          bVar3 = __gnu_cxx::operator!=(&local_3e0,&local_3f0);
          if (!bVar3) break;
          std::__cxx11::string::operator=((string *)&i,"LINK_INTERFACE_LIBRARIES_");
          pbVar10 = __gnu_cxx::
                    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&local_3e0);
          std::__cxx11::string::operator+=((string *)&i,(string *)pbVar10);
          pcVar2 = this->Target;
          pcVar8 = (char *)std::__cxx11::string::c_str();
          cmTarget::AppendProperty(pcVar2,(string *)&i,pcVar8,false);
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&local_3e0);
        }
      }
      if ((local_24 == OPTIMIZED_LibraryType) || (local_24 == GENERAL_LibraryType)) {
        pcVar2 = this->Target;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_410,"LINK_INTERFACE_LIBRARIES",
                   (allocator *)((long)&i_1._M_current + 7));
        pcVar8 = (char *)std::__cxx11::string::c_str();
        cmTarget::AppendProperty(pcVar2,&local_410,pcVar8,false);
        std::__cxx11::string::~string((string *)&local_410);
        std::allocator<char>::~allocator((allocator<char> *)((long)&i_1._M_current + 7));
        local_428._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&prop.field_2 + 8));
        __gnu_cxx::
        __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
        ::__normal_iterator<std::__cxx11::string*>
                  ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    *)&local_420,&local_428);
        while( true ) {
          local_430._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&prop.field_2 + 8));
          bVar3 = __gnu_cxx::operator!=(&local_420,&local_430);
          if (!bVar3) break;
          std::__cxx11::string::operator=((string *)&i,"LINK_INTERFACE_LIBRARIES_");
          pbVar10 = __gnu_cxx::
                    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&local_420);
          std::__cxx11::string::operator+=((string *)&i,(string *)pbVar10);
          pcVar8 = cmTarget::GetProperty(this->Target,(string *)&i);
          if (pcVar8 == (char *)0x0) {
            cmTarget::SetProperty(this->Target,(string *)&i,"");
          }
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&local_420);
        }
      }
      this_local._7_1_ = 1;
      local_27c = 1;
      std::__cxx11::string::~string((string *)&i);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&prop.field_2 + 8));
    }
  }
  else {
    this_local._7_1_ = 1;
  }
LAB_0055ae16:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool
cmTargetLinkLibrariesCommand::HandleLibrary(const std::string& lib,
                                            cmTargetLinkLibraryType llt)
{
  if(this->Target->GetType() == cmState::INTERFACE_LIBRARY
      && this->CurrentProcessingState != ProcessingKeywordLinkInterface)
    {
    this->Makefile->IssueMessage(cmake::FATAL_ERROR,
      "INTERFACE library can only be used with the INTERFACE keyword of "
      "target_link_libraries");
    return false;
    }

  cmTarget::TLLSignature sig =
        (this->CurrentProcessingState == ProcessingPlainPrivateInterface
      || this->CurrentProcessingState == ProcessingPlainPublicInterface
      || this->CurrentProcessingState == ProcessingKeywordPrivateInterface
      || this->CurrentProcessingState == ProcessingKeywordPublicInterface
      || this->CurrentProcessingState == ProcessingKeywordLinkInterface)
        ? cmTarget::KeywordTLLSignature : cmTarget::PlainTLLSignature;
  if (!this->Target->PushTLLCommandTrace(
        sig, this->Makefile->GetExecutionContext()))
    {
    std::ostringstream e;
    const char *modal = 0;
    cmake::MessageType messageType = cmake::AUTHOR_WARNING;
    switch(this->Makefile->GetPolicyStatus(cmPolicies::CMP0023))
      {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0023) << "\n";
        modal = "should";
      case cmPolicies::OLD:
        break;
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::NEW:
        modal = "must";
        messageType = cmake::FATAL_ERROR;
      }

      if(modal)
        {
        // If the sig is a keyword form and there is a conflict, the existing
        // form must be the plain form.
        const char *existingSig
                    = (sig == cmTarget::KeywordTLLSignature ? "plain"
                                                            : "keyword");
          e <<
            "The " << existingSig << " signature for target_link_libraries "
            "has already been used with the target \""
          << this->Target->GetName() << "\".  All uses of "
             "target_link_libraries with a target " << modal << " be either "
             "all-keyword or all-plain.\n";
        this->Target->GetTllSignatureTraces(e,
                                          sig == cmTarget::KeywordTLLSignature
                                            ? cmTarget::PlainTLLSignature
                                            : cmTarget::KeywordTLLSignature);
        this->Makefile->IssueMessage(messageType, e.str());
        if(messageType == cmake::FATAL_ERROR)
          {
          return false;
          }
        }
    }

  // Handle normal case first.
  if(this->CurrentProcessingState != ProcessingKeywordLinkInterface
      && this->CurrentProcessingState != ProcessingPlainLinkInterface)
    {
    this->Makefile
      ->AddLinkLibraryForTarget(this->Target->GetName(), lib, llt);
    if(this->CurrentProcessingState == ProcessingLinkLibraries)
      {
      this->Target->AppendProperty("INTERFACE_LINK_LIBRARIES",
        this->Target->GetDebugGeneratorExpressions(lib, llt).c_str());
      return true;
      }
    else if(this->CurrentProcessingState != ProcessingKeywordPublicInterface
            && this->CurrentProcessingState != ProcessingPlainPublicInterface)
      {
      if (this->Target->GetType() == cmState::STATIC_LIBRARY)
        {
        std::string configLib = this->Target
                                     ->GetDebugGeneratorExpressions(lib, llt);
        if (cmGeneratorExpression::IsValidTargetName(lib)
            || cmGeneratorExpression::Find(lib) != std::string::npos)
          {
          configLib = "$<LINK_ONLY:" + configLib + ">";
          }
        this->Target->AppendProperty("INTERFACE_LINK_LIBRARIES",
                                     configLib.c_str());
        }
      // Not a 'public' or 'interface' library. Do not add to interface
      // property.
      return true;
      }
    }

  this->Target->AppendProperty("INTERFACE_LINK_LIBRARIES",
              this->Target->GetDebugGeneratorExpressions(lib, llt).c_str());

  const cmPolicies::PolicyStatus policy22Status
                      = this->Target->GetPolicyStatusCMP0022();

  if (policy22Status != cmPolicies::OLD
      && policy22Status != cmPolicies::WARN)
    {
    return true;
    }

  if (this->Target->GetType() == cmState::INTERFACE_LIBRARY)
    {
    return true;
    }

  // Get the list of configurations considered to be DEBUG.
  std::vector<std::string> debugConfigs =
    this->Makefile->GetCMakeInstance()->GetDebugConfigs();
  std::string prop;

  // Include this library in the link interface for the target.
  if(llt == DEBUG_LibraryType || llt == GENERAL_LibraryType)
    {
    // Put in the DEBUG configuration interfaces.
    for(std::vector<std::string>::const_iterator i = debugConfigs.begin();
        i != debugConfigs.end(); ++i)
      {
      prop = "LINK_INTERFACE_LIBRARIES_";
      prop += *i;
      this->Target->AppendProperty(prop, lib.c_str());
      }
    }
  if(llt == OPTIMIZED_LibraryType || llt == GENERAL_LibraryType)
    {
    // Put in the non-DEBUG configuration interfaces.
    this->Target->AppendProperty("LINK_INTERFACE_LIBRARIES", lib.c_str());

    // Make sure the DEBUG configuration interfaces exist so that the
    // general one will not be used as a fall-back.
    for(std::vector<std::string>::const_iterator i = debugConfigs.begin();
        i != debugConfigs.end(); ++i)
      {
      prop = "LINK_INTERFACE_LIBRARIES_";
      prop += *i;
      if(!this->Target->GetProperty(prop))
        {
        this->Target->SetProperty(prop, "");
        }
      }
    }
  return true;
}